

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O3

uint64_t __thiscall
llvm::DataExtractor::getULEB128(DataExtractor *this,uint64_t *offset_ptr,Error *Err)

{
  byte bVar1;
  ulong uVar2;
  uint64_t Value;
  ulong uVar3;
  uint64_t uVar4;
  char *pcVar5;
  uint Shift;
  ErrorInfoBase *pEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  error_code EC;
  ulong local_30;
  
  uVar7 = *offset_ptr;
  uVar2 = (this->Data).Length;
  if (uVar2 < uVar7) {
    __assert_fail("*offset_ptr <= Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                  ,0xb0,"uint64_t llvm::DataExtractor::getULEB128(uint64_t *, llvm::Error *) const")
    ;
  }
  if (Err != (Error *)0x0) {
    uVar3 = (ulong)Err->Payload & 0xfffffffffffffffe;
    pEVar6 = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
    Err->Payload = pEVar6;
    if (uVar3 != 0) {
LAB_00d3a755:
      uVar4 = 0;
      goto LAB_00d3a757;
    }
  }
  pcVar5 = (this->Data).Data;
  uVar3 = 0;
  uVar4 = 0;
  do {
    if ((pcVar5 != (char *)0x0 && uVar2 == uVar7) || (0x3f < uVar3)) {
LAB_00d3a72c:
      if (Err == (Error *)0x0) {
        return 0;
      }
      pcVar5 = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = &local_30;
      createStringError(EC,pcVar5);
      pEVar6 = (ErrorInfoBase *)(local_30 | 1);
      Err->Payload = pEVar6;
      goto LAB_00d3a755;
    }
    bVar1 = pcVar5[uVar7];
    uVar9 = (ulong)(bVar1 & 0x7f);
    uVar8 = uVar9 << ((byte)uVar3 & 0x3f);
    if (uVar8 >> ((byte)uVar3 & 0x3f) != uVar9) goto LAB_00d3a72c;
    uVar4 = uVar4 + uVar8;
    uVar3 = uVar3 + 7;
    uVar7 = uVar7 + 1;
  } while ((char)bVar1 < '\0');
  *offset_ptr = uVar7;
  if (Err == (Error *)0x0) {
    return uVar4;
  }
  pEVar6 = Err->Payload;
LAB_00d3a757:
  uVar7 = (ulong)pEVar6 & 0xfffffffffffffffe;
  pEVar6 = (ErrorInfoBase *)0x1;
  if (uVar7 != 0) {
    pEVar6 = (ErrorInfoBase *)(uVar7 != 0 | uVar7);
  }
  Err->Payload = pEVar6;
  return uVar4;
}

Assistant:

uint64_t DataExtractor::getULEB128(uint64_t *offset_ptr,
                                   llvm::Error *Err) const {
  assert(*offset_ptr <= Data.size());
  ErrorAsOutParameter ErrAsOut(Err);
  if (isError(Err))
    return 0;

  const char *error;
  unsigned bytes_read;
  uint64_t result = decodeULEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error) {
    if (Err)
      *Err = createStringError(errc::illegal_byte_sequence, error);
    return 0;
  }
  *offset_ptr += bytes_read;
  return result;
}